

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O2

void __thiscall tvm::runtime::GraphRuntime::SetupStorage(GraphRuntime *this)

{
  uint uVar1;
  int iVar2;
  pointer pbVar3;
  pointer pvVar4;
  pointer piVar5;
  DLContext *pDVar6;
  DLContext ctx;
  pointer pNVar7;
  pointer pPVar8;
  TVMType TVar9;
  pointer paVar10;
  long *plVar11;
  ostream *poVar12;
  DLContext *pDVar13;
  long lVar14;
  DLContext *pDVar15;
  pointer plVar16;
  long lVar17;
  DLDeviceType DVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  pointer pbVar23;
  long lVar24;
  pointer pPVar25;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  LogCheckError _check_err;
  long local_260;
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  pool_entry;
  unsigned_long local_230;
  vector<DLDataType,_std::allocator<DLDataType>_> vtype;
  _Vector_base<long,_std::allocator<long>_> local_208;
  _Vector_base<long,_std::allocator<long>_> local_1f0;
  string local_1d8;
  vector<long,_std::allocator<long>_> shape;
  
  vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pbVar3 = (this->attrs_).dltype.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar23 = (this->attrs_).dltype.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar3; pbVar23 = pbVar23 + 1
      ) {
    std::__cxx11::string::string((string *)&local_1d8,(string *)pbVar23);
    TVar9 = String2TVMType(&local_1d8);
    shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,TVar9);
    std::vector<DLDataType,_std::allocator<DLDataType>_>::emplace_back<DLDataType>
              (&vtype,(anon_struct_4_3_3efc03b1 *)&shape);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  pool_entry.
  super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pool_entry.
  super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pool_entry.
  super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar19 = 0;
  while( true ) {
    pPVar8 = pool_entry.
             super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar4 = (this->attrs_).shape.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->attrs_).shape.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar19)
    break;
    piVar5 = (this->attrs_).device_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar5 == (this->attrs_).device_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      paVar10 = (this->ctxs_).super__Vector_base<DLContext,_std::allocator<DLContext>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      paVar10 = (pointer)(piVar5 + uVar19);
    }
    uVar1 = (this->attrs_).storage_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19];
    uVar22 = (ulong)uVar1;
    DVar18 = paVar10->device_type;
    lVar24 = 1;
    for (plVar11 = pvVar4[uVar19].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        plVar11 !=
        *(pointer *)
         ((long)&pvVar4[uVar19].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data + 8); plVar11 = plVar11 + 1) {
      lVar24 = lVar24 * *plVar11;
    }
    dmlc::LogCheck_GE(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88);
    if (_check_err.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&shape,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0x100);
      poVar12 = std::operator<<((ostream *)&shape,"Check failed: ");
      poVar12 = std::operator<<(poVar12,"storage_id >= 0");
      poVar12 = std::operator<<(poVar12,(string *)_check_err.str);
      poVar12 = std::operator<<(poVar12,": ");
      std::operator<<(poVar12,"Do not support runtime shape op");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&shape);
    }
    dmlc::LogCheckError::~LogCheckError(&_check_err);
    uVar20 = (uint)vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19].lanes *
             (uint)vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19].bits;
    if (uVar20 != 1 && (uVar20 & 7) != 0) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&shape,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0x103);
      poVar12 = std::operator<<((ostream *)&shape,"Check failed: bits % 8U == 0U || bits == 1U");
      std::operator<<(poVar12,": ");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&shape);
    }
    if (uVar22 < (ulong)((long)pool_entry.
                               super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pool_entry.
                               super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      if ((pool_entry.
           super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar22].device_type != 0xffffffff) &&
         (pool_entry.
          super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar22].device_type != DVar18)) {
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&shape,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0x10b);
        poVar12 = std::operator<<((ostream *)&shape,
                                  "Check failed: pool_entry[sid].device_type == -1 || pool_entry[sid].device_type == device_type"
                                 );
        poVar12 = std::operator<<(poVar12,": ");
        std::operator<<(poVar12,"The same pool entry cannot be assigned to multiple devices");
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&shape);
      }
    }
    else {
      shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_finish._4_4_,0xffffffff);
      std::
      vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ::resize(&pool_entry,(ulong)(uVar1 + 1),(value_type *)&shape);
    }
    uVar21 = (ulong)(uVar20 + 7 >> 3) * lVar24;
    if (uVar21 < pool_entry.
                 super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar22].size) {
      uVar21 = pool_entry.
               super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22].size;
    }
    pool_entry.
    super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar22].size = uVar21;
    pool_entry.
    super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar22].device_type = DVar18;
    uVar19 = uVar19 + 1;
  }
  pPVar25 = pool_entry.
            super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pPVar25 == pPVar8) {
      std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::resize
                (&this->data_entry_,
                 (ulong)(this->node_row_ptr_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]);
      local_260 = 0;
      lVar24 = 0;
      for (uVar19 = 0;
          uVar19 < (ulong)((long)(this->data_entry_).
                                 super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->data_entry_).
                                 super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar19 = uVar19 + 1) {
        plVar16 = (pointer)(long)(this->attrs_).storage_id.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar19];
        local_230 = (long)(this->storage_pool_).
                          super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->storage_pool_).
                          super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
        shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = plVar16;
        dmlc::LogCheck_LT<unsigned_long,unsigned_long>
                  ((dmlc *)&_check_err,(unsigned_long *)&shape,&local_230);
        if (_check_err.str != (string *)0x0) {
          dmlc::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&shape,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                     ,0x127);
          poVar12 = std::operator<<((ostream *)&shape,"Check failed: ");
          poVar12 = std::operator<<(poVar12,"static_cast<size_t>(storage_id) < storage_pool_.size()"
                                   );
          poVar12 = std::operator<<(poVar12,(string *)_check_err.str);
          std::operator<<(poVar12,": ");
          dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&shape);
        }
        dmlc::LogCheckError::~LogCheckError(&_check_err);
        pNVar7 = (this->storage_pool_).
                 super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_208,
                   (vector<long,_std::allocator<long>_> *)
                   ((long)&(((this->attrs_).shape.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data + local_260));
        NDArray::CreateView((NDArray *)&shape,
                            (vector<long,_std::allocator<long>_> *)(pNVar7 + (long)plVar16),
                            SUB84(&local_208,0));
        NDArray::operator=((NDArray *)
                           ((long)&((this->data_entry_).
                                    super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->data_ + lVar24),
                           (NDArray *)&shape);
        NDArray::~NDArray((NDArray *)&shape);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_208);
        lVar24 = lVar24 + 8;
        local_260 = local_260 + 0x18;
      }
      std::
      _Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ::~_Vector_base(&pool_entry.
                       super__Vector_base<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                     );
      std::_Vector_base<DLDataType,_std::allocator<DLDataType>_>::~_Vector_base
                (&vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>);
      return;
    }
    shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pDVar13 = (DLContext *)
              (this->ctxs_).super__Vector_base<DLContext,_std::allocator<DLContext>_>._M_impl.
              super__Vector_impl_data._M_start;
    pDVar6 = (DLContext *)
             (this->ctxs_).super__Vector_base<DLContext,_std::allocator<DLContext>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar24 = 0x18;
    lVar17 = 0;
    for (lVar14 = (long)pDVar6 - (long)pDVar13 >> 5; 0 < lVar14; lVar14 = lVar14 + -1) {
      iVar2 = pPVar25->device_type;
      if (iVar2 == *(int *)((long)&pDVar13[-3].device_type + lVar24)) {
        pDVar15 = (DLContext *)((long)pDVar13 - lVar17);
        goto LAB_0010d5fc;
      }
      if (iVar2 == *(int *)((long)&pDVar13[-2].device_type + lVar24)) {
        pDVar15 = (DLContext *)((long)pDVar13 + (8 - lVar17));
        goto LAB_0010d5fc;
      }
      if (iVar2 == *(int *)((long)&pDVar13[-1].device_type + lVar24)) {
        pDVar15 = (DLContext *)((long)pDVar13 + (0x10 - lVar17));
        goto LAB_0010d5fc;
      }
      if (iVar2 == *(int *)((long)&pDVar13->device_type + lVar24)) {
        pDVar15 = (DLContext *)((long)pDVar13 + (0x18 - lVar17));
        goto LAB_0010d5fc;
      }
      lVar17 = lVar17 + -0x20;
      lVar24 = lVar24 + 0x20;
    }
    lVar14 = ((long)pDVar6 - (long)pDVar13) + lVar17 >> 3;
    pDVar15 = (DLContext *)((long)pDVar13 - lVar17);
    if (lVar14 == 1) {
      DVar18 = pPVar25->device_type;
LAB_0010d5f6:
      if (DVar18 != pDVar15->device_type) {
        pDVar15 = pDVar6;
      }
LAB_0010d5fc:
      if (pDVar15 != pDVar6) {
        pDVar13 = pDVar15;
      }
    }
    else {
      if (lVar14 == 2) {
        DVar18 = pPVar25->device_type;
LAB_0010d5e8:
        if (DVar18 != pDVar15->device_type) {
          pDVar15 = pDVar15 + 1;
          goto LAB_0010d5f6;
        }
        goto LAB_0010d5fc;
      }
      if (lVar14 == 3) {
        DVar18 = pPVar25->device_type;
        if (DVar18 != *(DLDeviceType *)((long)&pDVar13[-3].device_type + lVar24)) {
          pDVar15 = (DLContext *)((long)pDVar13 + (8 - lVar17));
          goto LAB_0010d5e8;
        }
        goto LAB_0010d5fc;
      }
    }
    ctx = *pDVar13;
    _check_err.str = (string *)((long)(pPVar25->size + 3) / 4);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              ((vector<long,_std::allocator<long>_> *)
               &shape.super__Vector_base<long,_std::allocator<long>_>,(long *)&_check_err);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_1f0,
               (vector<long,_std::allocator<long>_> *)
               &shape.super__Vector_base<long,_std::allocator<long>_>);
    NDArray::Empty((NDArray *)&_check_err,(vector<long,_std::allocator<long>_> *)&local_1f0,
                   (DLDataType)0x12002,ctx);
    std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::
    emplace_back<tvm::runtime::NDArray>(&this->storage_pool_,(NDArray *)&_check_err);
    NDArray::~NDArray((NDArray *)&_check_err);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_1f0);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&shape.super__Vector_base<long,_std::allocator<long>_>);
    pPVar25 = pPVar25 + 1;
  } while( true );
}

Assistant:

void GraphRuntime::SetupStorage() {
  // Grab saved optimization plan from graph.
  std::vector<TVMType> vtype;
  for (const std::string &s_type : attrs_.dltype) {
    vtype.push_back(tvm::runtime::String2TVMType(s_type));
  }

  // Size and device type of each storage pool entry.
  std::vector<PoolEntry> pool_entry;
  // Find the maximum space size.
  for (size_t i = 0; i < attrs_.shape.size(); ++i) {
    int storage_id = attrs_.storage_id[i];
    // Use the fallback device if no device index is available.
    int device_type = static_cast<int>(ctxs_[0].device_type);
    if (!attrs_.device_index.empty()) {
      device_type = attrs_.device_index[i];
    }
    size_t size = 1;
    for (int64_t sz : attrs_.shape[i]) {
      size *= static_cast<size_t>(sz);
    }
    CHECK_GE(storage_id, 0) << "Do not support runtime shape op";
    DLDataType t = vtype[i];
    size_t bits = t.bits * t.lanes;
    CHECK(bits % 8U == 0U || bits == 1U);
    size_t bytes = ((bits + 7U) / 8U) * size;

    uint32_t sid = static_cast<uint32_t>(storage_id);
    if (sid >= pool_entry.size()) {
      pool_entry.resize(sid + 1, {0, -1});
    } else {
      CHECK(pool_entry[sid].device_type == -1 ||
            pool_entry[sid].device_type == device_type)
          << "The same pool entry cannot be assigned to multiple devices";
    }
    pool_entry[sid].size = std::max(pool_entry[sid].size, bytes);
    pool_entry[sid].device_type = device_type;
  }

  // Allocate the space.
  for (const auto &pit : pool_entry) {
    std::vector<int64_t> shape;
    // This for loop is very fast since there are usually only a couple of
    // devices available on the same hardware.
    const auto &cit =
        std::find_if(ctxs_.begin(), ctxs_.end(), [&pit](const TVMContext &c) {
          return pit.device_type == static_cast<int>(c.device_type);
        });
    TVMContext ctx = cit == ctxs_.end() ? ctxs_[0] : *cit;
    shape.push_back(static_cast<int64_t>(pit.size + 3) / 4);
    storage_pool_.push_back(
        NDArray::Empty(shape, DLDataType{kDLFloat, 32, 1}, ctx));
  }

  // Assign the pooled entries. A unified memory pool is used to simplifiy
  // memory assignment for each node entry. The allocated memory on each device
  // is mapped to this pool.
  data_entry_.resize(num_node_entries());
  for (size_t i = 0; i < data_entry_.size(); ++i) {
    int storage_id = attrs_.storage_id[i];
    CHECK_LT(static_cast<size_t>(storage_id), storage_pool_.size());
    data_entry_[i] =
        storage_pool_[storage_id].CreateView(attrs_.shape[i], vtype[i]);
  }
}